

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_extended_test.cc
# Opt level: O3

void test_multi_readers(multi_reader_type reader_type,char *test_name)

{
  bool bVar1;
  fdb_status fVar2;
  void *__s;
  long lVar3;
  undefined8 extraout_RAX;
  int in_ECX;
  code *__start_routine;
  ulong uVar4;
  undefined4 *puVar5;
  undefined1 *puVar6;
  char *__format;
  pthread_t *__newthread;
  bool bVar7;
  undefined4 local_208 [2];
  long alStack_200 [4];
  long alStack_1e0 [7];
  void *local_1a8 [2];
  pthread_t local_198 [2];
  undefined1 auStack_188 [8];
  undefined1 local_180 [8];
  fdb_config fconfig;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_file_handle *local_40;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  
  puVar5 = (undefined4 *)auStack_188;
  puVar6 = auStack_188;
  local_198[1] = 0x1059fd;
  gettimeofday((timeval *)&fconfig.num_blocks_readahead,(__timezone_ptr_t)0x0);
  local_198[1] = 0x105a02;
  memleak_start();
  local_198[1] = 0x105a0e;
  system("rm -rf  test.fdb* > errorlog.txt");
  local_198[1] = 0x105a1d;
  fdb_get_default_config();
  fconfig.wal_flush_before_commit = true;
  fconfig.num_bgflusher_threads._0_4_ = cur_encryption;
  local_198[1] = 0x105a40;
  _set_random_string((char *)((long)&fconfig.num_bgflusher_threads + 4),0x20);
  local_198[1] = 0x105a49;
  fdb_get_default_kvs_config();
  local_198[1] = 0x105a5c;
  fVar2 = fdb_open(&local_40,test_filename,(fdb_config *)local_180);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    local_198[1] = 0x105a75;
    fVar2 = fdb_kvs_open_default
                      (local_40,(fdb_kvs_handle **)&dbfile,(fdb_kvs_config *)&__test_begin.tv_usec);
    puVar5 = (undefined4 *)auStack_188;
    if (fVar2 == FDB_RESULT_SUCCESS) {
      local_198[1] = 0x105a98;
      fVar2 = fdb_set_log_callback((fdb_kvs_handle *)dbfile,logCallbackFunc,"multi_reader_thread");
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00105c73;
      local_198[1] = 0x105aaa;
      __s = operator_new(800000);
      local_198[1] = 0x105acb;
      kvs_config.custom_cmp_param = __s;
      memset(__s,0,800000);
      local_198[1] = 0x105adf;
      loadDocsWithRandomKeys
                (local_40,(fdb_kvs_handle *)dbfile,
                 (vector<fdb_doc_struct_*,_std::allocator<fdb_doc_struct_*>_> *)
                 &kvs_config.custom_cmp_param,in_ECX);
      local_198[1] = 0x105ae8;
      fdb_kvs_close((fdb_kvs_handle *)dbfile);
      local_198[1] = 0x105af1;
      fdb_close(local_40);
      puVar5 = local_208;
      lVar3 = 0;
      bVar1 = true;
      do {
        bVar7 = bVar1;
        puVar5[lVar3 * 0xc] = (int)lVar3;
        alStack_200[lVar3 * 6] = 100000;
        alStack_200[lVar3 * 6 + 1] = (long)&kvs_config.custom_cmp_param;
        alStack_200[lVar3 * 6 + 2] = (long)local_180;
        alStack_1e0[lVar3 * 6 + -1] = (long)&__test_begin.tv_usec;
        *(undefined4 *)(alStack_1e0 + lVar3 * 6) = 1;
        if (reader_type == MULTI_SNAPSHOT_READERS) {
          __newthread = local_198 + lVar3;
LAB_00105b7e:
          __start_routine = _snapshot_reader_thread;
        }
        else {
          if (reader_type != MULTI_READERS) {
            __newthread = local_198;
            if (bVar7) goto LAB_00105b7e;
            pthread_create(local_198 + lVar3,(pthread_attr_t *)0x0,_reader_thread,
                           puVar5 + lVar3 * 0xc);
            break;
          }
          __newthread = local_198 + lVar3;
          __start_routine = _reader_thread;
        }
        pthread_create(__newthread,(pthread_attr_t *)0x0,__start_routine,puVar5 + lVar3 * 0xc);
        lVar3 = 1;
        bVar1 = false;
      } while (bVar7);
      lVar3 = 0;
      bVar1 = true;
      do {
        bVar7 = bVar1;
        pthread_join(local_198[lVar3],local_1a8 + lVar3);
        lVar3 = 1;
        bVar1 = false;
      } while (bVar7);
      uVar4 = 0;
      while (uVar4 < (ulong)((long)__s + (800000 - (long)kvs_config.custom_cmp_param) >> 3)) {
        fdb_doc_free(*(fdb_doc **)((long)kvs_config.custom_cmp_param + uVar4 * 8));
        uVar4 = uVar4 + 1;
        if (uVar4 == 100000) {
          fdb_shutdown();
          memleak_end();
          __format = "%s PASSED\n";
          if (test_multi_readers(multi_reader_type,char_const*)::__test_pass != '\0') {
            __format = "%s FAILED\n";
          }
          fprintf(_stderr,__format,test_name);
          if (kvs_config.custom_cmp_param != (void *)0x0) {
            operator_delete(kvs_config.custom_cmp_param);
          }
          return;
        }
      }
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4);
      goto LAB_00105c69;
    }
  }
  else {
LAB_00105c69:
    *(undefined8 *)(puVar5 + -2) = 0x105c6e;
    test_multi_readers();
  }
  puVar6 = (undefined1 *)puVar5;
  *(undefined8 *)(puVar6 + -8) = 0x105c73;
  test_multi_readers();
LAB_00105c73:
  *(undefined8 *)(puVar6 + -8) = 0x105c78;
  test_multi_readers();
  if (kvs_config.custom_cmp_param != (void *)0x0) {
    *(undefined8 *)(puVar6 + -8) = 0x105c91;
    operator_delete(kvs_config.custom_cmp_param);
  }
  *(code **)(puVar6 + -8) = test_writer_multi_readers;
  _Unwind_Resume(extraout_RAX);
}

Assistant:

static void test_multi_readers(multi_reader_type reader_type,
                               const char *test_name) {
    TEST_INIT();
    memleak_start();

    int r;
    int num_docs = 100000;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status status;
    size_t n_readers = num_readers;

    // remove previous extended_test files
    r = system(SHELL_DEL" test.fdb* > errorlog.txt");
    (void)r;

    fdb_config fconfig = getDefaultConfig();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    status = fdb_open(&dbfile, test_filename, &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "multi_reader_thread");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Create a vector of docs on the heap
    std::vector<fdb_doc *> docs(num_docs, nullptr);

    // Load the initial documents with random keys.
    loadDocsWithRandomKeys(dbfile, db, &docs, num_docs);
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // create reader threads.
    thread_t *tid = alca(thread_t, n_readers);
    void **thread_ret = alca(void *, n_readers);
    struct reader_thread_args *args = alca(struct reader_thread_args, n_readers);
    for (size_t i = 0; i < n_readers; ++i){
        args[i].tid = i;
        args[i].ndocs = num_docs;
        args[i].docs = &docs;
        args[i].config = &fconfig;
        args[i].kvs_config = &kvs_config;
        args[i].check_body = 1;
        if (reader_type == MULTI_READERS) {
            thread_create(&tid[i], _reader_thread, &args[i]);
        } else if (reader_type == MULTI_SNAPSHOT_READERS) {
            thread_create(&tid[i], _snapshot_reader_thread, &args[i]);
        } else { // mixed
            if (i % 2) {
                thread_create(&tid[i], _reader_thread, &args[i]);
            } else {
                thread_create(&tid[i], _snapshot_reader_thread, &args[i]);
            }
        }
    }

    // wait for thread termination
    for (size_t i = 0; i < n_readers; ++i){
        thread_join(tid[i], &thread_ret[i]);
    }

    // free all documents
    for (int i = 0 ; i < num_docs; ++i){
        fdb_doc_free(docs.at(i));
    }

    // shutdown
    fdb_shutdown();

    memleak_end();
    TEST_RESULT(test_name);
}